

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

TxRelay * __thiscall anon_unknown.dwarf_2e4871d::Peer::SetTxRelay(Peer *this)

{
  TxRelay *this_00;
  _Rb_tree_header *p_Var1;
  TxRelay *__s;
  TxRelay *__ptr_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock20;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_tx_relay_mutex).super_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  __s = (TxRelay *)operator_new(0xe0);
  memset(__s,0,0xe0);
  *(undefined4 *)((long)&(__s->m_bloom_filter_mutex).super_recursive_mutex + 0x10) = 1;
  *(undefined8 *)((long)&(__s->m_tx_inventory_mutex).super_recursive_mutex + 8) = 0;
  *(undefined8 *)((long)&(__s->m_tx_inventory_mutex).super_recursive_mutex + 0x10) = 0;
  (__s->m_bloom_filter)._M_t.super___uniq_ptr_impl<CBloomFilter,_std::default_delete<CBloomFilter>_>
  ._M_t = (tuple<CBloomFilter_*,_std::default_delete<CBloomFilter>_>)0x0;
  (__s->m_tx_inventory_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align =
       0;
  *(undefined8 *)((long)&(__s->m_tx_inventory_mutex).super_recursive_mutex + 0x18) = 0;
  *(undefined8 *)((long)&(__s->m_tx_inventory_mutex).super_recursive_mutex + 0x20) = 0;
  *(undefined4 *)((long)&(__s->m_tx_inventory_mutex).super_recursive_mutex + 0x10) = 1;
  __ptr_00 = (TxRelay *)0xc350;
  CRollingBloomFilter::CRollingBloomFilter(&__s->m_tx_inventory_known_filter,50000,1e-06);
  p_Var1 = (_Rb_tree_header *)((long)&(__s->m_tx_inventory_to_send)._M_t + 8);
  (((_Rb_tree_header *)((long)&(__s->m_tx_inventory_to_send)._M_t + 8))->_M_header)._M_color =
       _S_red;
  *(_Base_ptr *)((long)&(__s->m_tx_inventory_to_send)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&(__s->m_tx_inventory_to_send)._M_t + 0x18) = p_Var1;
  *(_Rb_tree_header **)((long)&(__s->m_tx_inventory_to_send)._M_t + 0x20) = p_Var1;
  *(size_t *)((long)&(__s->m_tx_inventory_to_send)._M_t + 0x28) = 0;
  __s->m_send_mempool = false;
  (__s->m_next_inv_send_time).__r = 0;
  __s->m_last_inv_sequence = 1;
  (__s->m_fee_filter_received).super___atomic_base<long>._M_i = 0;
  this_00 = (this->m_tx_relay)._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::Peer::TxRelay,_std::default_delete<(anonymous_namespace)::Peer::TxRelay>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::Peer::TxRelay_*,_std::default_delete<(anonymous_namespace)::Peer::TxRelay>_>
            .super__Head_base<0UL,_(anonymous_namespace)::Peer::TxRelay_*,_false>._M_head_impl;
  (this->m_tx_relay)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::Peer::TxRelay,_std::default_delete<(anonymous_namespace)::Peer::TxRelay>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::Peer::TxRelay_*,_std::default_delete<(anonymous_namespace)::Peer::TxRelay>_>
  .super__Head_base<0UL,_(anonymous_namespace)::Peer::TxRelay_*,_false>._M_head_impl = __s;
  if (this_00 != (TxRelay *)0x0) {
    std::default_delete<(anonymous_namespace)::Peer::TxRelay>::operator()
              ((default_delete<(anonymous_namespace)::Peer::TxRelay> *)this_00,__ptr_00);
    __s = (this->m_tx_relay)._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::Peer::TxRelay,_std::default_delete<(anonymous_namespace)::Peer::TxRelay>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::Peer::TxRelay_*,_std::default_delete<(anonymous_namespace)::Peer::TxRelay>_>
          .super__Head_base<0UL,_(anonymous_namespace)::Peer::TxRelay_*,_false>._M_head_impl;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __s;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_tx_relay_mutex)
    {
        LOCK(m_tx_relay_mutex);
        Assume(!m_tx_relay);
        m_tx_relay = std::make_unique<Peer::TxRelay>();
        return m_tx_relay.get();
    }